

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.h
# Opt level: O3

size_t __thiscall
xemmai::t_context::f_tail<&xemmai::t_type_of<xemmai::t_object>::f_subtract>
          (t_context *this,t_object *a_this)

{
  size_t sVar1;
  t_pvalue *ptVar2;
  t_pvalue *ptVar3;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  ptVar3 = this->v_base + *(long *)(this->v_lambda->v_data + 0x28);
  sVar1 = (*a_this->v_type->f_subtract)(a_this,ptVar3);
  if (sVar1 == 0xffffffffffffffff) {
    ptVar2 = this->v_base;
    ptVar2[-2].super_t_pointer.v_p = (ptVar3->super_t_pointer).v_p;
    ptVar2[-2].field_0 = ptVar3->field_0;
    ptVar3 = this->v_previous;
  }
  else {
    ptVar2 = this->v_base;
    lVar4 = (long)(sVar1 * 0x10 + 0x20) >> 4;
    if (0 < lVar4) {
      uVar5 = lVar4 + 1;
      lVar4 = 0;
      do {
        *(undefined8 *)((long)&ptVar2[-2].super_t_pointer.v_p + lVar4) =
             *(undefined8 *)((long)&(ptVar3->super_t_pointer).v_p + lVar4);
        *(undefined8 *)((long)ptVar2 + lVar4 + -0x18) =
             *(undefined8 *)((long)&ptVar3->field_0 + lVar4);
        uVar5 = uVar5 - 1;
        lVar4 = lVar4 + 0x10;
      } while (1 < uVar5);
      ptVar2 = this->v_base;
    }
    ptVar3 = ptVar2 + sVar1;
    if (ptVar2 + sVar1 <= this->v_previous) {
      ptVar3 = this->v_previous;
    }
  }
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar3;
  return sVar1;
}

Assistant:

size_t t_context::f_tail(t_object* a_this)
{
	auto stack = v_base + v_lambda->f_as<t_lambda>().v_privates;
	size_t n = (a_this->f_type()->*A_function)(a_this, stack);
	if (n == size_t(-1))
		f_return(stack[0]);
	else
		f_tail(stack, n);
	return n;
}